

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Select * sqlite3SelectNew(Parse *pParse,ExprList *pEList,SrcList *pSrc,Expr *pWhere,
                         ExprList *pGroupBy,Expr *pHaving,ExprList *pOrderBy,u16 selFlags,
                         Expr *pLimit,Expr *pOffset)

{
  sqlite3 *db;
  Select *p;
  Expr *pExpr;
  Select standin;
  Token local_b8;
  Select local_a8;
  
  db = pParse->db;
  p = (Select *)sqlite3DbMallocRaw(db,0x78);
  if (p == (Select *)0x0) {
    p = &local_a8;
    local_a8.pLimit = (Expr *)0x0;
    local_a8.pOffset = (Expr *)0x0;
    local_a8.pPrior = (Select *)0x0;
    local_a8.pNext = (Select *)0x0;
    local_a8.pHaving = (Expr *)0x0;
    local_a8.pOrderBy = (ExprList *)0x0;
    local_a8.pWhere = (Expr *)0x0;
    local_a8.pGroupBy = (ExprList *)0x0;
    local_a8.nSelectRow = 0;
    local_a8.pSrc = (SrcList *)0x0;
    local_a8.iOffset = 0;
    local_a8.addrOpenEphm[0] = 0;
    local_a8.addrOpenEphm[1] = 0;
    local_a8._28_4_ = 0;
    local_a8.pEList = (ExprList *)0x0;
    local_a8.op = '\0';
    local_a8._9_1_ = 0;
    local_a8.selFlags = 0;
    local_a8.iLimit = 0;
  }
  else {
    p->pLimit = (Expr *)0x0;
    p->pOffset = (Expr *)0x0;
    p->pPrior = (Select *)0x0;
    p->pNext = (Select *)0x0;
    p->pHaving = (Expr *)0x0;
    p->pOrderBy = (ExprList *)0x0;
    p->pWhere = (Expr *)0x0;
    p->pGroupBy = (ExprList *)0x0;
    p->nSelectRow = 0;
    p->pSrc = (SrcList *)0x0;
    p->iOffset = 0;
    p->addrOpenEphm[0] = 0;
    *(undefined8 *)(p->addrOpenEphm + 1) = 0;
    p->pEList = (ExprList *)0x0;
    p->op = '\0';
    p->field_0x9 = 0;
    p->selFlags = 0;
    p->iLimit = 0;
  }
  p->pWith = (With *)0x0;
  if (pEList == (ExprList *)0x0) {
    local_b8.z = (char *)0x0;
    local_b8.n = 0;
    pExpr = sqlite3ExprAlloc(db,0x74,&local_b8,0);
    pEList = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pExpr);
  }
  p->pEList = pEList;
  if (pSrc == (SrcList *)0x0) {
    pSrc = (SrcList *)sqlite3DbMallocRaw(db,0x78);
    if (pSrc == (SrcList *)0x0) {
      pSrc = (SrcList *)0x0;
    }
    else {
      pSrc->a[0].colUsed = 0;
      pSrc->a[0].zIndex = (char *)0x0;
      pSrc->a[0].pOn = (Expr *)0x0;
      pSrc->a[0].pUsing = (IdList *)0x0;
      pSrc->a[0].regResult = 0;
      pSrc->a[0].jointype = '\0';
      pSrc->a[0].field_0x3d = 0;
      pSrc->a[0].iSelectId = '\0';
      pSrc->a[0].field_0x3f = 0;
      *(undefined8 *)&pSrc->a[0].iCursor = 0;
      pSrc->a[0].pSelect = (Select *)0x0;
      pSrc->a[0].addrFillSub = 0;
      pSrc->a[0].regReturn = 0;
      pSrc->a[0].zAlias = (char *)0x0;
      pSrc->a[0].pTab = (Table *)0x0;
      pSrc->a[0].zDatabase = (char *)0x0;
      pSrc->a[0].zName = (char *)0x0;
      pSrc->nSrc = 0;
      pSrc->nAlloc = 0;
      pSrc->a[0].pSchema = (Schema *)0x0;
      pSrc->a[0].pIndex = (Index *)0x0;
    }
  }
  p->pSrc = pSrc;
  p->pWhere = pWhere;
  p->pGroupBy = pGroupBy;
  p->pHaving = pHaving;
  p->pOrderBy = pOrderBy;
  p->selFlags = selFlags;
  p->op = 'w';
  p->pLimit = pLimit;
  p->pOffset = pOffset;
  p->addrOpenEphm[0] = -1;
  p->addrOpenEphm[1] = -1;
  if (db->mallocFailed != '\0') {
    clearSelect(db,p,(uint)(p != &local_a8));
    p = (Select *)0x0;
  }
  return p;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3SelectNew(
  Parse *pParse,        /* Parsing context */
  ExprList *pEList,     /* which columns to include in the result */
  SrcList *pSrc,        /* the FROM clause -- which tables to scan */
  Expr *pWhere,         /* the WHERE clause */
  ExprList *pGroupBy,   /* the GROUP BY clause */
  Expr *pHaving,        /* the HAVING clause */
  ExprList *pOrderBy,   /* the ORDER BY clause */
  u16 selFlags,         /* Flag parameters, such as SF_Distinct */
  Expr *pLimit,         /* LIMIT value.  NULL means not used */
  Expr *pOffset         /* OFFSET value.  NULL means no offset */
){
  Select *pNew;
  Select standin;
  sqlite3 *db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  assert( db->mallocFailed || !pOffset || pLimit ); /* OFFSET implies LIMIT */
  if( pNew==0 ){
    assert( db->mallocFailed );
    pNew = &standin;
    memset(pNew, 0, sizeof(*pNew));
  }
  if( pEList==0 ){
    pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db,TK_ALL,0));
  }
  pNew->pEList = pEList;
  if( pSrc==0 ) pSrc = sqlite3DbMallocZero(db, sizeof(*pSrc));
  pNew->pSrc = pSrc;
  pNew->pWhere = pWhere;
  pNew->pGroupBy = pGroupBy;
  pNew->pHaving = pHaving;
  pNew->pOrderBy = pOrderBy;
  pNew->selFlags = selFlags;
  pNew->op = TK_SELECT;
  pNew->pLimit = pLimit;
  pNew->pOffset = pOffset;
  assert( pOffset==0 || pLimit!=0 );
  pNew->addrOpenEphm[0] = -1;
  pNew->addrOpenEphm[1] = -1;
  if( db->mallocFailed ) {
    clearSelect(db, pNew, pNew!=&standin);
    pNew = 0;
  }else{
    assert( pNew->pSrc!=0 || pParse->nErr>0 );
  }
  assert( pNew!=&standin );
  return pNew;
}